

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::visitLoad(I64ToI32Lowering *this,Load *curr)

{
  bool bVar1;
  uint uVar2;
  Builder *pBVar3;
  address64_t aVar4;
  undefined4 uVar5;
  Id IVar6;
  byte bVar7;
  undefined4 *puVar8;
  Expression *pEVar9;
  LocalSet *args;
  Const *pCVar10;
  Binary *this_00;
  LocalSet *append;
  LocalGet *args_1;
  Block *expression;
  uint uVar11;
  ulong uVar12;
  Type local_c8;
  char *pcStack_c0;
  LocalSet *local_b8;
  undefined1 local_b0 [8];
  TempVar lowBits;
  TempVar highBits;
  TempVar ptrTemp;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id != 3) {
    return;
  }
  if (curr->isAtomic == true) {
    __assert_fail("!curr->isAtomic && \"64-bit atomic load not implemented\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                  ,0x17b,"void wasm::I64ToI32Lowering::visitLoad(Load *)");
  }
  getTemp((TempVar *)local_b0,this,(Type)0x2);
  getTemp((TempVar *)&lowBits.ty,this,(Type)0x2);
  getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
  if ((char)ptrTemp.pass == '\x01') goto LAB_00733696;
  local_b8 = Builder::makeLocalSet
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                        (Id)highBits.ty.id,curr->ptr);
  IVar6 = (Id)highBits.ty.id;
  uVar5 = local_b0._0_4_;
  if (curr->bytes == '\b') {
    if ((char)highBits.pass == '\x01') goto LAB_00733696;
    uVar2 = (uint)(curr->align).addr;
    uVar11 = 4;
    if (uVar2 < 4) {
      uVar11 = uVar2;
    }
    if ((char)ptrTemp.pass == '\x01') goto LAB_00733696;
    pBVar3 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    bVar1 = curr->signed_;
    aVar4 = (curr->offset).addr;
    puVar8 = (undefined4 *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x18,8);
    *puVar8 = 8;
    puVar8[4] = IVar6;
    *(undefined8 *)(puVar8 + 2) = 2;
    local_c8.id = (curr->memory).super_IString.str._M_len;
    pcStack_c0 = (curr->memory).super_IString.str._M_str;
    pEVar9 = (Expression *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x48,8);
    pEVar9->_id = LoadId;
    *(undefined1 *)&pEVar9[2].type.id = 0;
    *(undefined1 *)&pEVar9[1]._id = BreakId;
    *(bool *)((long)&pEVar9[1]._id + 1) = bVar1;
    pEVar9[1].type.id = aVar4 + 4;
    *(ulong *)(pEVar9 + 2) = (ulong)uVar11;
    *(undefined4 **)(pEVar9 + 3) = puVar8;
    (pEVar9->type).id = 2;
    pEVar9[3].type.id = local_c8.id;
    *(char **)(pEVar9 + 4) = pcStack_c0;
    args = Builder::makeLocalSet(pBVar3,(Index)lowBits.ty.id,pEVar9);
  }
  else {
    pBVar3 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    if (curr->signed_ == true) {
      if (((char)highBits.pass != '\0') || ((char)lowBits.pass == '\x01')) goto LAB_00733696;
      pEVar9 = (Expression *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x18,8);
      pEVar9->_id = LocalGetId;
      pEVar9[1]._id = uVar5;
      (pEVar9->type).id = 2;
      pCVar10 = Builder::makeConst<int>
                          ((this->builder)._M_t.
                           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                           .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x1f);
      this_00 = (Binary *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x28,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      this_00->op = ShrSInt32;
      this_00->left = pEVar9;
      this_00->right = (Expression *)pCVar10;
      Binary::finalize(this_00);
      args = Builder::makeLocalSet(pBVar3,(Index)lowBits.ty.id,(Expression *)this_00);
    }
    else {
      if ((char)highBits.pass != '\0') goto LAB_00733696;
      pCVar10 = Builder::makeConst<int>(pBVar3,0);
      args = Builder::makeLocalSet(pBVar3,(Index)lowBits.ty.id,(Expression *)pCVar10);
    }
  }
  (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
  bVar7 = curr->bytes;
  if (3 < bVar7) {
    bVar7 = 4;
  }
  curr->bytes = bVar7;
  uVar2 = (uint)(curr->align).addr;
  uVar12 = 4;
  if (uVar2 < 4) {
    uVar12 = (ulong)uVar2;
  }
  (curr->align).addr = uVar12;
  if ((char)ptrTemp.pass != '\x01') {
    pEVar9 = (Expression *)
             MixedArena::allocSpace
                       (&((this->builder)._M_t.
                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                          .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                         allocator,0x18,8);
    pEVar9->_id = LocalGetId;
    pEVar9[1]._id = (Id)highBits.ty.id;
    (pEVar9->type).id = 2;
    curr->ptr = pEVar9;
    if ((char)lowBits.pass != '\x01') {
      pBVar3 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      append = Builder::makeLocalSet(pBVar3,local_b0._0_4_,(Expression *)curr);
      if ((char)lowBits.pass != '\x01') {
        args_1 = (LocalGet *)
                 MixedArena::allocSpace
                           (&((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                             allocator,0x18,8);
        (args_1->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id =
             LocalGetId;
        args_1->index = local_b0._0_4_;
        (args_1->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
        expression = Builder::blockify<wasm::LocalSet*,wasm::LocalGet*>
                               (pBVar3,(Expression *)local_b8,(Expression *)append,args,args_1);
        Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                  (&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                    ).
                    super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                    .
                    super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                   ,(Expression *)expression);
        local_c8.id = (uintptr_t)expression;
        std::
        _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                  ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->highBitVars,&local_c8,&lowBits.ty);
        TempVar::~TempVar((TempVar *)&highBits.ty);
        TempVar::~TempVar((TempVar *)&lowBits.ty);
        TempVar::~TempVar((TempVar *)local_b0);
        return;
      }
    }
  }
LAB_00733696:
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4c,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

void visitLoad(Load* curr) {
    if (curr->type != Type::i64) {
      return;
    }
    assert(!curr->isAtomic && "64-bit atomic load not implemented");
    TempVar lowBits = getTemp();
    TempVar highBits = getTemp();
    TempVar ptrTemp = getTemp();
    LocalSet* setPtr = builder->makeLocalSet(ptrTemp, curr->ptr);
    LocalSet* loadHigh;
    if (curr->bytes == 8) {
      loadHigh = builder->makeLocalSet(
        highBits,
        builder->makeLoad(4,
                          curr->signed_,
                          curr->offset + 4,
                          std::min(uint32_t(curr->align), uint32_t(4)),
                          builder->makeLocalGet(ptrTemp, Type::i32),
                          Type::i32,
                          curr->memory));
    } else if (curr->signed_) {
      loadHigh = builder->makeLocalSet(
        highBits,
        builder->makeBinary(ShrSInt32,
                            builder->makeLocalGet(lowBits, Type::i32),
                            builder->makeConst(int32_t(31))));
    } else {
      loadHigh =
        builder->makeLocalSet(highBits, builder->makeConst(int32_t(0)));
    }
    curr->type = Type::i32;
    curr->bytes = std::min(curr->bytes, uint8_t(4));
    curr->align = std::min(uint32_t(curr->align), uint32_t(4));
    curr->ptr = builder->makeLocalGet(ptrTemp, Type::i32);
    Block* result =
      builder->blockify(setPtr,
                        builder->makeLocalSet(lowBits, curr),
                        loadHigh,
                        builder->makeLocalGet(lowBits, Type::i32));
    replaceCurrent(result);
    setOutParam(result, std::move(highBits));
  }